

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O1

uint32_t __thiscall
duckdb_apache::thrift::protocol::
TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::EncryptionTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
::readBool(TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::EncryptionTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
           *this,reference value)

{
  _func_int **pp_Var1;
  undefined8 in_RAX;
  ulong uVar2;
  ulong *puVar3;
  bool bVar4;
  char cVar5;
  uint8_t b [1];
  char local_21;
  
  local_21 = (char)((ulong)in_RAX >> 0x38);
  puVar3 = value._M_p;
  bVar4 = (char)this[1].super_TProtocolDefaults.super_TProtocol.input_recursion_depth_ != '\x01';
  if (bVar4) {
    pp_Var1 = this[1].super_TProtocolDefaults.super_TProtocol._vptr_TProtocol;
    (**(code **)(*pp_Var1 + 0x38))(pp_Var1,&local_21,1);
    cVar5 = local_21 == '\x01';
  }
  else {
    cVar5 = *(char *)((long)&this[1].super_TProtocolDefaults.super_TProtocol.input_recursion_depth_
                     + 1);
    *(undefined1 *)&this[1].super_TProtocolDefaults.super_TProtocol.input_recursion_depth_ = 0;
  }
  if (cVar5 == '\0') {
    uVar2 = ~value._M_mask & *puVar3;
  }
  else {
    uVar2 = value._M_mask | *puVar3;
  }
  *puVar3 = uVar2;
  return (uint)bVar4;
}

Assistant:

uint32_t readBool(duckdb::vector<bool>::reference value) {
    bool b = false;
    uint32_t ret = static_cast<Protocol_*>(this)->readBool(b);
    value = b;
    return ret;
  }